

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::GLMClassifier::Clear(GLMClassifier *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
            (&(this->weights_).super_RepeatedPtrFieldBase);
  (this->offset_).current_size_ = 0;
  this->postevaluationtransform_ = 0;
  this->classencoding_ = 0;
  clear_ClassLabels(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GLMClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GLMClassifier)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  weights_.Clear();
  offset_.Clear();
  ::memset(&postevaluationtransform_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&classencoding_) -
      reinterpret_cast<char*>(&postevaluationtransform_)) + sizeof(classencoding_));
  clear_ClassLabels();
  _internal_metadata_.Clear<std::string>();
}